

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator-(unsigned_long_long lhs,
         SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  if (rhs.m_int <= lhs) {
    return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
           (lhs - rhs.m_int);
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }